

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

string * __thiscall
LexData::id_text_abi_cxx11_(string *__return_storage_ptr__,LexData *this,Token *tok)

{
  int iVar1;
  int iVar2;
  pointer puVar3;
  
  puVar3 = (this->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = tok->i;
  iVar2 = tok->j;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((string *)__return_storage_ptr__,puVar3 + iVar1,puVar3 + iVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string id_text(const Token& tok) const {
    return std::string(ids.begin()+tok.i,
                       ids.begin()+tok.j);
  }